

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiColumns *pIVar1;
  ImGuiColumnData *pIVar2;
  float fVar3;
  ImVec2 IVar4;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1 == (ImGuiColumns *)0x0) {
    IVar4 = GetContentRegionAvail();
    fVar3 = IVar4.x;
  }
  else {
    if (column_index < 0) {
      column_index = pIVar1->Current;
    }
    if ((pIVar1->Columns).Size <= column_index + 1) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                    ,0x503,"T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
    }
    pIVar2 = (pIVar1->Columns).Data;
    fVar3 = (pIVar1->OffMaxX - pIVar1->OffMinX) *
            (pIVar2[column_index + 1].OffsetNorm - pIVar2[column_index].OffsetNorm);
  }
  return fVar3;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return GetContentRegionAvail().x;

    if (column_index < 0)
        column_index = columns->Current;
    return GetColumnOffsetFromNorm(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}